

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O2

DdManager * Llb_ManConstructGlobalBdds(Aig_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  DdManager *unique;
  DdNode *pDVar2;
  void *pvVar3;
  int iVar4;
  
  unique = Cudd_Init(p->nObjs[2],0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  pAVar1 = p->pConst1;
  pDVar2 = Cudd_ReadOne(unique);
  (pAVar1->field_5).pData = pDVar2;
  Cudd_Ref(pDVar2);
  for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar4);
    pDVar2 = Cudd_bddIthVar(unique,iVar4);
    *(DdNode **)((long)pvVar3 + 0x28) = pDVar2;
    Cudd_Ref(pDVar2);
  }
  for (iVar4 = 0; iVar4 < p->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(p->vObjs,iVar4);
    if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
      pDVar2 = Cudd_bddAnd(unique,(DdNode *)
                                  ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                                  *(ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) +
                                            0x28)),
                           (DdNode *)
                           ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^
                           *(ulong *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x28)
                           ));
      *(DdNode **)((long)pvVar3 + 0x28) = pDVar2;
      Cudd_Ref(pDVar2);
    }
  }
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCos,iVar4);
    pDVar2 = (DdNode *)
             ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
             *(ulong *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x28));
    *(DdNode **)((long)pvVar3 + 0x28) = pDVar2;
    Cudd_Ref(pDVar2);
  }
  return unique;
}

Assistant:

DdManager * Llb_ManConstructGlobalBdds( Aig_Man_t * p )
{
    DdManager * dd;
    DdNode * bBdd0, * bBdd1;
    Aig_Obj_t * pObj;
    int i;
    dd = Cudd_Init( Aig_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    pObj = Aig_ManConst1(p);
    pObj->pData = Cudd_ReadOne(dd);  Cudd_Ref( (DdNode *)pObj->pData );
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Cudd_bddIthVar(dd, i);  Cudd_Ref( (DdNode *)pObj->pData );
    }
    Aig_ManForEachNode( p, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( (DdNode *)pObj->pData );
    }
    Aig_ManForEachCo( p, pObj, i )
    {
        pObj->pData = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );  Cudd_Ref( (DdNode *)pObj->pData );
    }
    return dd;
}